

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O2

int XmlParseXmlDecl(int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                   char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                   int *standalone)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  ENCODING *pEVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *end_00;
  char *local_100;
  int local_f4;
  char *local_f0;
  char *val;
  char *name;
  char *local_d8;
  char **local_d0;
  char *local_c8;
  char *local_c0;
  char buf [128];
  
  val = (char *)0x0;
  name = (char *)0x0;
  local_f0 = (char *)0x0;
  local_100 = ptr + (long)enc->minBytesPerChar * 5;
  end_00 = end + (long)enc->minBytesPerChar * -2;
  local_f4 = isGeneralTextEntity;
  local_d0 = badPtr;
  iVar2 = parsePseudoAttribute(enc,local_100,end_00,&name,&local_f0,&val,&local_100);
  pcVar6 = name;
  pcVar5 = local_f0;
  pcVar7 = local_100;
  if (iVar2 == 0 || name == (char *)0x0) goto LAB_0030ee3e;
  iVar2 = (*enc->nameMatchesAscii)(enc,name,local_f0,"version");
  if (iVar2 == 0) {
    pcVar7 = pcVar6;
    if (local_f4 == 0) goto LAB_0030ee3e;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = val;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_100;
    }
    iVar2 = parsePseudoAttribute(enc,local_100,end_00,&name,&local_f0,&val,&local_100);
    pcVar7 = local_100;
    if (iVar2 == 0) goto LAB_0030ee3e;
    pcVar5 = local_f0;
    pcVar6 = name;
    if (name == (char *)0x0) {
      if (local_f4 == 0) {
        return 1;
      }
      goto LAB_0030ee3e;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar6,pcVar5,"encoding");
  pcVar7 = val;
  if (iVar2 != 0) {
    uVar3 = toAscii(enc,val,end_00);
    if (0x19 < (uVar3 & 0xffffffdf) - 0x41) goto LAB_0030ee3e;
    if (encodingName != (char **)0x0) {
      *encodingName = pcVar7;
    }
    pcVar5 = local_100;
    if (encoding != (ENCODING **)0x0) {
      local_d8 = local_100;
      pcVar5 = local_100 + -(long)enc->minBytesPerChar;
      local_c0 = pcVar7;
      local_c8 = buf;
      (*enc->utf8Convert)(enc,&local_c0,pcVar5,&local_c8,buf + 0x7f);
      if (local_c0 == pcVar5) {
        *local_c8 = '\0';
        iVar2 = streqci(buf,"UTF-16");
        if ((iVar2 == 0) || (pEVar4 = enc, enc->minBytesPerChar != 2)) {
          iVar2 = getEncodingIndex(buf);
          if (iVar2 == -1) goto LAB_0030ed8a;
          pEVar4 = encodings[iVar2];
        }
      }
      else {
LAB_0030ed8a:
        pEVar4 = (ENCODING *)0x0;
      }
      *encoding = pEVar4;
      pcVar5 = local_d8;
    }
    iVar2 = parsePseudoAttribute(enc,pcVar5,end_00,&name,&local_f0,&val,&local_100);
    pcVar7 = local_100;
    if (iVar2 == 0) goto LAB_0030ee3e;
    pcVar5 = local_f0;
    pcVar6 = name;
    if (name == (char *)0x0) {
      return 1;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar6,pcVar5,"standalone");
  pcVar1 = val;
  pcVar5 = local_100;
  pcVar7 = pcVar6;
  if ((local_f4 != 0) || (iVar2 == 0)) goto LAB_0030ee3e;
  iVar2 = (*enc->nameMatchesAscii)(enc,val,local_100 + -(long)enc->minBytesPerChar,"yes");
  if (iVar2 == 0) {
    iVar2 = (*enc->nameMatchesAscii)(enc,pcVar1,pcVar5 + -(long)enc->minBytesPerChar,"no");
    pcVar7 = pcVar1;
    if (iVar2 == 0) goto LAB_0030ee3e;
    iVar2 = 0;
    if (standalone != (int *)0x0) goto LAB_0030ee83;
  }
  else if (standalone != (int *)0x0) {
    iVar2 = 1;
LAB_0030ee83:
    *standalone = iVar2;
  }
  while ((uVar3 = toAscii(enc,pcVar5,end_00), uVar3 < 0x21 &&
         ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0))) {
    pcVar5 = pcVar5 + enc->minBytesPerChar;
  }
  pcVar7 = pcVar5;
  if (pcVar5 == end_00) {
    return 1;
  }
LAB_0030ee3e:
  *local_d0 = pcVar7;
  return 0;
}

Assistant:

int
NS(XmlParseXmlDecl)(int isGeneralTextEntity,
                    const ENCODING *enc,
                    const char *ptr,
                    const char *end,
                    const char **badPtr,
                    const char **versionPtr,
                    const char **versionEndPtr,
                    const char **encodingName,
                    const ENCODING **encoding,
                    int *standalone)
{
  return doParseXmlDecl(NS(findEncoding),
                        isGeneralTextEntity,
                        enc,
                        ptr,
                        end,
                        badPtr,
                        versionPtr,
                        versionEndPtr,
                        encodingName,
                        encoding,
                        standalone);
}